

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hdr_histogram_test.c
# Opt level: O1

char * test_percentiles(void)

{
  _Bool _Var1;
  int64_t iVar2;
  char *pcVar3;
  
  load_histograms();
  iVar2 = hdr_value_at_percentile(raw_histogram,30.0);
  _Var1 = compare_double((double)iVar2,1000.0,1.0);
  pcVar3 = "Value at 30% not 1000.0";
  if (_Var1) {
    iVar2 = hdr_value_at_percentile(raw_histogram,99.0);
    _Var1 = compare_double((double)iVar2,1000.0,1.0);
    if (_Var1) {
      iVar2 = hdr_value_at_percentile(raw_histogram,99.99);
      _Var1 = compare_double((double)iVar2,1000.0,1.0);
      if (_Var1) {
        iVar2 = hdr_value_at_percentile(raw_histogram,99.999);
        _Var1 = compare_double((double)iVar2,100000000.0,100000.0);
        if (_Var1) {
          iVar2 = hdr_value_at_percentile(raw_histogram,100.0);
          _Var1 = compare_double((double)iVar2,100000000.0,100000.0);
          if (_Var1) {
            iVar2 = hdr_value_at_percentile(cor_histogram,30.0);
            _Var1 = compare_double((double)iVar2,1000.0,1.0);
            if (_Var1) {
              iVar2 = hdr_value_at_percentile(cor_histogram,50.0);
              _Var1 = compare_double((double)iVar2,1000.0,1.0);
              if (_Var1) {
                iVar2 = hdr_value_at_percentile(cor_histogram,75.0);
                _Var1 = compare_double((double)iVar2,50000000.0,50000.0);
                if (_Var1) {
                  iVar2 = hdr_value_at_percentile(cor_histogram,90.0);
                  _Var1 = compare_double((double)iVar2,80000000.0,80000.0);
                  if (_Var1) {
                    iVar2 = hdr_value_at_percentile(cor_histogram,99.0);
                    _Var1 = compare_double((double)iVar2,98000000.0,98000.0);
                    if (_Var1) {
                      iVar2 = hdr_value_at_percentile(cor_histogram,99.999);
                      _Var1 = compare_double((double)iVar2,100000000.0,100000.0);
                      pcVar3 = "Value at 99.999% not 100000000.0";
                      if (_Var1) {
                        iVar2 = hdr_value_at_percentile(cor_histogram,100.0);
                        _Var1 = compare_double((double)iVar2,100000000.0,100000.0);
                        pcVar3 = (char *)0x0;
                        if (!_Var1) {
                          pcVar3 = "Value at 100% not 100000000.0";
                        }
                      }
                    }
                    else {
                      pcVar3 = "Value at 99% not 98000000.0";
                    }
                  }
                  else {
                    pcVar3 = "Value at 90% not 80000000.0";
                  }
                }
                else {
                  pcVar3 = "Value at 75% not 50000000.0";
                }
              }
              else {
                pcVar3 = "Value at 50% not 1000.0";
              }
            }
          }
          else {
            pcVar3 = "Value at 100% not 100000000.0";
          }
        }
        else {
          pcVar3 = "Value at 99.999% not 100000000.0";
        }
      }
      else {
        pcVar3 = "Value at 99.99% not 1000.0";
      }
    }
    else {
      pcVar3 = "Value at 99% not 1000.0";
    }
  }
  return pcVar3;
}

Assistant:

static char* test_percentiles(void)
{
    load_histograms();

    mu_assert("Value at 30% not 1000.0",
              compare_percentile(hdr_value_at_percentile(raw_histogram, 30.0), 1000.0, 0.001));
    mu_assert("Value at 99% not 1000.0",
              compare_percentile(hdr_value_at_percentile(raw_histogram, 99.0), 1000.0, 0.001));
    mu_assert("Value at 99.99% not 1000.0",
              compare_percentile(hdr_value_at_percentile(raw_histogram, 99.99), 1000.0, 0.001));
    mu_assert("Value at 99.999% not 100000000.0",
              compare_percentile(hdr_value_at_percentile(raw_histogram, 99.999), 100000000.0, 0.001));
    mu_assert("Value at 100% not 100000000.0",
              compare_percentile(hdr_value_at_percentile(raw_histogram, 100.0), 100000000.0, 0.001));

    mu_assert("Value at 30% not 1000.0",
              compare_percentile(hdr_value_at_percentile(cor_histogram, 30.0), 1000.0, 0.001));
    mu_assert("Value at 50% not 1000.0",
              compare_percentile(hdr_value_at_percentile(cor_histogram, 50.0), 1000.0, 0.001));
    mu_assert("Value at 75% not 50000000.0",
              compare_percentile(hdr_value_at_percentile(cor_histogram, 75.0), 50000000.0, 0.001));
    mu_assert("Value at 90% not 80000000.0",
              compare_percentile(hdr_value_at_percentile(cor_histogram, 90.0), 80000000.0, 0.001));
    mu_assert("Value at 99% not 98000000.0",
              compare_percentile(hdr_value_at_percentile(cor_histogram, 99.0), 98000000.0, 0.001));
    mu_assert("Value at 99.999% not 100000000.0",
              compare_percentile(hdr_value_at_percentile(cor_histogram, 99.999), 100000000.0, 0.001));
    mu_assert("Value at 100% not 100000000.0",
              compare_percentile(hdr_value_at_percentile(cor_histogram, 100.0), 100000000.0, 0.001));

    return 0;
}